

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QRect __thiscall
QStyleSheetStyle::positionRect
          (QStyleSheetStyle *this,QWidget *w,QRenderRule *rule2,int pe,QRect *originRect,
          LayoutDirection dir)

{
  QStyleSheetPositionData *pQVar1;
  QStyleSheetGeometryData *pQVar2;
  bool bVar3;
  PositionMode PVar4;
  QSize QVar5;
  int *piVar6;
  int iVar7;
  QSize QVar8;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  int iVar9;
  QSize QVar10;
  int iVar11;
  int *piVar12;
  long in_FS_OFFSET;
  QRect QVar13;
  QSize local_50;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (rule2->p).d.ptr;
  if ((pQVar1 == (QStyleSheetPositionData *)0x0) ||
     (PVar4 = pQVar1->mode, PVar4 == PositionMode_Unknown)) {
    if (((uint)pe < 0x37) && ((0x4600000fe00000U >> ((ulong)(uint)pe & 0x3f) & 1) != 0)) {
      PVar4 = PositionMode_Absolute;
    }
    else {
      PVar4 = PositionMode_Static;
    }
    if (pQVar1 != (QStyleSheetPositionData *)0x0) goto LAB_0033e911;
  }
  else {
LAB_0033e911:
    alignment.i = (pQVar1->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i;
    if (alignment.i != 0) goto switchD_0033e93a_caseD_5;
  }
  alignment.i = 0x81;
  switch(pe) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 9:
  case 0xc:
  case 0xe:
  case 0x12:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x31:
    alignment.i = 0x84;
    break;
  case 5:
  case 6:
  case 0x25:
  case 0x27:
    break;
  case 7:
  case 0xd:
  case 0x13:
  case 0x18:
  case 0x1b:
    alignment.i = 0x42;
    break;
  case 8:
  case 0xb:
  case 0x11:
  case 0x19:
  case 0x1a:
  case 0x3b:
  case 0x3c:
    alignment.i = 0x22;
    break;
  default:
    alignment.i = 0;
    break;
  case 0xf:
  case 0x10:
    alignment.i = 0x21;
    break;
  case 0x28:
  case 0x2b:
  case 0x2c:
    alignment.i = 0x82;
  }
switchD_0033e93a_caseD_5:
  stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  if (PVar4 == PositionMode_Absolute) {
    if (pQVar1 == (QStyleSheetPositionData *)0x0) {
      QVar13 = *originRect;
    }
    else {
      piVar6 = &pQVar1->right;
      if (dir == LeftToRight) {
        piVar6 = &pQVar1->left;
      }
      piVar12 = &pQVar1->left;
      if (dir == LeftToRight) {
        piVar12 = &pQVar1->right;
      }
      QVar13 = QRect::adjusted(originRect,*piVar6,pQVar1->top,-*piVar12,-pQVar1->bottom);
    }
    _local_48 = QVar13;
    bVar3 = QRenderRule::hasContentsSize(rule2);
    if (bVar3) {
      QVar5 = QRenderRule::size(rule2);
      pQVar2 = (rule2->geo).d.ptr;
      if (pQVar2 == (QStyleSheetGeometryData *)0x0) {
        QVar10.wd.m_i = 0;
        QVar10.ht.m_i = 0;
      }
      else {
        QVar10.wd.m_i = pQVar2->minWidth;
        QVar10.ht.m_i = pQVar2->minHeight;
      }
      QVar8 = QVar10;
      if (QVar10.wd.m_i.m_i < QVar5.wd.m_i.m_i) {
        QVar8 = QVar5;
      }
      if (QVar10.ht.m_i.m_i < QVar5.ht.m_i.m_i) {
        QVar10 = QVar5;
      }
      local_50 = (QSize)(((ulong)QVar10 & 0xffffffff00000000) + ((ulong)QVar8 & 0xffffffff));
      if (QVar8.wd.m_i.m_i == -1) {
        local_50.wd.m_i = (QVar13.x2.m_i.m_i - QVar13.x1.m_i) + 1;
      }
      if (QVar10.ht.m_i.m_i == -1) {
        local_50.ht.m_i = (QVar13.y2.m_i.m_i - QVar13.y1.m_i) + 1;
      }
      QVar13 = QStyle::alignedRect(dir,(Alignment)alignment.i,&local_50,(QRect *)local_48);
    }
  }
  else {
    QVar5 = QRenderRule::size(rule2);
    QVar5 = defaultSize(this,w,QVar5,originRect,pe);
    pQVar2 = (rule2->geo).d.ptr;
    if (pQVar2 == (QStyleSheetGeometryData *)0x0) {
      QVar8.wd.m_i = 0;
      QVar8.ht.m_i = 0;
    }
    else {
      QVar8.wd.m_i = pQVar2->minWidth;
      QVar8.ht.m_i = pQVar2->minHeight;
    }
    QVar10 = QVar5;
    if (QVar5.wd.m_i.m_i <= QVar8.wd.m_i.m_i) {
      QVar10 = QVar8;
    }
    if (QVar8.ht.m_i.m_i < QVar5.ht.m_i.m_i) {
      QVar8 = QVar5;
    }
    local_50 = (QSize)((ulong)QVar10 & 0xffffffff | (ulong)QVar8 & 0xffffffff00000000);
    QVar13 = QStyle::alignedRect(dir,(Alignment)alignment.i,&local_50,originRect);
    if (pQVar1 != (QStyleSheetPositionData *)0x0) {
      iVar7 = pQVar1->left;
      if (iVar7 == 0) {
        iVar7 = -pQVar1->right;
      }
      iVar9 = pQVar1->top;
      if (iVar9 == 0) {
        iVar9 = -pQVar1->bottom;
      }
      iVar11 = -iVar7;
      if (dir == LeftToRight) {
        iVar11 = iVar7;
      }
      local_48._4_4_ = QVar13.y1.m_i.m_i + iVar9;
      local_48._0_4_ = QVar13.x1.m_i.m_i + iVar11;
      local_48._8_4_ = iVar11 + QVar13.x2.m_i.m_i;
      RStack_3c.m_i = QVar13.y2.m_i.m_i + iVar9;
      QVar13 = _local_48;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar13;
  }
  __stack_chk_fail();
}

Assistant:

QRect QStyleSheetStyle::positionRect(const QWidget *w, const QRenderRule &rule2, int pe,
                                     const QRect &originRect, Qt::LayoutDirection dir) const
{
    const QStyleSheetPositionData *p = rule2.position();
    PositionMode mode = (p && p->mode != PositionMode_Unknown) ? p->mode : defaultPositionMode(pe);
    Qt::Alignment position = (p && p->position != 0) ? p->position : defaultPosition(pe);
    QRect r;

    if (mode != PositionMode_Absolute) {
        QSize sz = defaultSize(w, rule2.size(), originRect, pe);
        sz = sz.expandedTo(rule2.minimumContentsSize());
        r = QStyle::alignedRect(dir, position, sz, originRect);
        if (p) {
            int left = p->left ? p->left : -p->right;
            int top = p->top ? p->top : -p->bottom;
            r.translate(dir == Qt::LeftToRight ? left : -left, top);
        }
    } else {
        r = p ? originRect.adjusted(dir == Qt::LeftToRight ? p->left : p->right, p->top,
                                   dir == Qt::LeftToRight ? -p->right : -p->left, -p->bottom)
              : originRect;
        if (rule2.hasContentsSize()) {
            QSize sz = rule2.size().expandedTo(rule2.minimumContentsSize());
            if (sz.width() == -1) sz.setWidth(r.width());
            if (sz.height() == -1) sz.setHeight(r.height());
            r = QStyle::alignedRect(dir, position, sz, r);
        }
    }
    return r;
}